

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O1

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,AggregateFunction *function)

{
  LogicalType *this_00;
  long lVar1;
  aggregate_size_t *pp_Var2;
  aggregate_size_t *pp_Var3;
  byte bVar4;
  CreateAggregateFunctionInfo info;
  AggregateFunction local_318;
  CreateAggregateFunctionInfo local_1e8;
  
  bVar4 = 0;
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_318,(SimpleFunction *)function);
  local_318.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  this_00 = &local_318.super_BaseScalarFunction.return_type;
  LogicalType::LogicalType(this_00,&(function->super_BaseScalarFunction).return_type);
  local_318.super_BaseScalarFunction.stability = (function->super_BaseScalarFunction).stability;
  local_318.super_BaseScalarFunction.null_handling =
       (function->super_BaseScalarFunction).null_handling;
  local_318.super_BaseScalarFunction.errors = (function->super_BaseScalarFunction).errors;
  local_318.super_BaseScalarFunction.collation_handling =
       (function->super_BaseScalarFunction).collation_handling;
  local_318.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  pp_Var2 = &function->state_size;
  pp_Var3 = &local_318.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = *pp_Var2;
    pp_Var2 = pp_Var2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_318.order_dependent = function->order_dependent;
  local_318.distinct_dependent = function->distinct_dependent;
  local_318.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (function->function_info).internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_318.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (function->function_info).internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  (function->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (function->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  CreateAggregateFunctionInfo::CreateAggregateFunctionInfo(&local_1e8,&local_318);
  local_318.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_318.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_318.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::~LogicalType(this_00);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_318);
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateFunction(this->catalog,this->transaction,&local_1e8.super_CreateFunctionInfo);
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateAggregateFunctionInfo_024922d0;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::~vector
            (&local_1e8.functions.super_FunctionSet<duckdb::AggregateFunction>.functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.functions.super_FunctionSet<duckdb::AggregateFunction>.name._M_dataplus._M_p !=
      &local_1e8.functions.super_FunctionSet<duckdb::AggregateFunction>.name.field_2) {
    operator_delete(local_1e8.functions.super_FunctionSet<duckdb::AggregateFunction>.name.
                    _M_dataplus._M_p);
  }
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateFunctionInfo_024779b0;
  ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (&local_1e8.super_CreateFunctionInfo.descriptions.
              super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p !=
      &local_1e8.super_CreateFunctionInfo.alias_of.field_2) {
    operator_delete(local_1e8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.super_CreateFunctionInfo.name._M_dataplus._M_p !=
      &local_1e8.super_CreateFunctionInfo.name.field_2) {
    operator_delete(local_1e8.super_CreateFunctionInfo.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo((CreateInfo *)&local_1e8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(AggregateFunction function) {
	CreateAggregateFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}